

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O2

bool __thiscall wallet::BerkeleyRODatabase::Backup(BerkeleyRODatabase *this,string *dest)

{
  bool bVar1;
  char cVar2;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  string local_c0;
  path dst;
  path src;
  path local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::__cxx11::path::path(&src.super_path,&(this->m_filepath).super_path);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_50,dest,auto_format);
  std::filesystem::__cxx11::path::path(&dst.super_path,&local_50);
  std::filesystem::__cxx11::path::~path(&local_50);
  bVar1 = std::filesystem::is_directory(&dst.super_path);
  if (bVar1) {
    BDBDataFile((path *)&local_50,&dst);
    std::filesystem::__cxx11::path::operator=(&dst.super_path,&local_50);
    std::filesystem::__cxx11::path::~path(&local_50);
  }
  bVar1 = std::filesystem::exists(&dst.super_path);
  if (bVar1) {
    cVar2 = std::filesystem::equivalent((path *)&src,(path *)&dst);
    if (cVar2 != '\0') {
      std::filesystem::__cxx11::path::string(&local_50._M_pathname,&dst.super_path);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/migrate.cpp"
      ;
      source_file._M_len = 0x62;
      logging_function._M_str = "Backup";
      logging_function._M_len = 6;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,0x2cd,ALL,Info,(ConstevalFormatString<1U>)0xe0d789,
                 &local_50._M_pathname);
      std::__cxx11::string::~string((string *)&local_50);
      bVar1 = false;
      goto LAB_009d1348;
    }
  }
  std::filesystem::copy_file((path *)&src,(path *)&dst,overwrite_existing);
  std::filesystem::__cxx11::path::string(&local_50._M_pathname,&(this->m_filepath).super_path);
  std::filesystem::__cxx11::path::string(&local_c0,&dst.super_path);
  source_file_00._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/migrate.cpp"
  ;
  source_file_00._M_len = 0x62;
  logging_function_00._M_str = "Backup";
  logging_function_00._M_len = 6;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function_00,source_file_00,0x2d2,ALL,Info,(ConstevalFormatString<2U>)0xe0d7b1,
             &local_50._M_pathname,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = true;
LAB_009d1348:
  std::filesystem::__cxx11::path::~path(&dst.super_path);
  std::filesystem::__cxx11::path::~path(&src.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool BerkeleyRODatabase::Backup(const std::string& dest) const
{
    fs::path src(m_filepath);
    fs::path dst(fs::PathFromString(dest));

    if (fs::is_directory(dst)) {
        dst = BDBDataFile(dst);
    }
    try {
        if (fs::exists(dst) && fs::equivalent(src, dst)) {
            LogPrintf("cannot backup to wallet source file %s\n", fs::PathToString(dst));
            return false;
        }

        fs::copy_file(src, dst, fs::copy_options::overwrite_existing);
        LogPrintf("copied %s to %s\n", fs::PathToString(m_filepath), fs::PathToString(dst));
        return true;
    } catch (const fs::filesystem_error& e) {
        LogPrintf("error copying %s to %s - %s\n", fs::PathToString(m_filepath), fs::PathToString(dst), fsbridge::get_filesystem_error_message(e));
        return false;
    }
}